

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O3

void __thiscall
xray_re::cse_alife_monster_abstract::cse_alife_monster_abstract(cse_alife_monster_abstract *this)

{
  cse_alife_creature_abstract::cse_alife_creature_abstract(&this->super_cse_alife_creature_abstract)
  ;
  *(undefined ***)&this->super_cse_alife_creature_abstract =
       &PTR__cse_alife_monster_abstract_00247148;
  *(undefined ***)&(this->super_cse_alife_creature_abstract).field_0x118 =
       &PTR__cse_alife_monster_abstract_002471b0;
  this->m_next_graph_id = 0xffff;
  this->m_prev_graph_id = 0xffff;
  this->m_distance_from_point = 0.0;
  this->m_distance_to_point = 0.0;
  (this->m_out_space_restrictors)._M_dataplus._M_p =
       (pointer)&(this->m_out_space_restrictors).field_2;
  (this->m_out_space_restrictors)._M_string_length = 0;
  (this->m_out_space_restrictors).field_2._M_local_buf[0] = '\0';
  (this->m_in_space_restrictors)._M_dataplus._M_p = (pointer)&(this->m_in_space_restrictors).field_2
  ;
  (this->m_in_space_restrictors)._M_string_length = 0;
  (this->m_in_space_restrictors).field_2._M_local_buf[0] = '\0';
  this->m_smart_terrain_id = 0xffff;
  this->m_task_reached = false;
  return;
}

Assistant:

cse_alife_monster_abstract::cse_alife_monster_abstract():
	m_next_graph_id(UNDEF16), m_prev_graph_id(UNDEF16),
	m_distance_from_point(0), m_distance_to_point(0),
	m_smart_terrain_id(UNDEF16), m_task_reached(false) {}